

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  iterator this_00;
  bool bVar1;
  WorkingMode WVar2;
  char *pcVar3;
  cmMakefile *pcVar4;
  size_type sVar5;
  reference ppcVar6;
  pointer __x;
  reference gti_00;
  cmake *pcVar7;
  ostream *poVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string local_888 [39];
  allocator local_861;
  string local_860 [8];
  string f;
  char **log;
  char *logs [3];
  undefined1 local_818 [8];
  ostringstream msg;
  allocator local_699;
  string local_698;
  char local_678 [8];
  char num [100];
  cmTarget local_5f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  local_3b8;
  __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
  local_158;
  __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
  local_150;
  iterator gti;
  cmTargets *targets;
  cmMakefile *mf;
  undefined1 local_130 [4];
  uint i;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  allocator local_101;
  value_type local_100;
  cmMakefile *local_e0;
  cmMakefile *dirMf;
  string local_d0;
  cmStateDirectory local_b0;
  allocator local_71;
  string local_70;
  cmStateDirectory local_50;
  undefined1 local_28 [8];
  cmStateSnapshot snapshot;
  cmGlobalGenerator *this_local;
  
  this->FirstTimeProgress = 0.0;
  snapshot.Position.Position = (PositionType)this;
  ClearGeneratorMembers(this);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_28,this->CMakeInstance);
  cmStateSnapshot::GetDirectory(&local_50,(cmStateSnapshot *)local_28);
  pcVar3 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,pcVar3,&local_71);
  cmStateDirectory::SetCurrentSource(&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cmStateSnapshot::GetDirectory(&local_b0,(cmStateSnapshot *)local_28);
  pcVar3 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,pcVar3,(allocator *)((long)&dirMf + 7));
  cmStateDirectory::SetCurrentBinary(&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dirMf + 7));
  pcVar4 = (cmMakefile *)operator_new(0x760);
  cmMakefile::cmMakefile(pcVar4,this,(cmStateSnapshot *)local_28);
  local_e0 = pcVar4;
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back(&this->Makefiles,&local_e0);
  IndexMakefile(this,local_e0);
  pcVar3 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,pcVar3,&local_101);
  pVar9 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->BinaryDirectories,&local_100);
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar9.first._M_node;
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(local_e0);
  cmMakefile::EnforceDirectoryLevelRules(local_e0);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
            *)local_130);
  CreateDefaultGlobalTargets
            (this,(vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)local_130);
  for (mf._4_4_ = 0;
      sVar5 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::size(&this->Makefiles),
      mf._4_4_ < sVar5; mf._4_4_ = mf._4_4_ + 1) {
    ppcVar6 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,(ulong)mf._4_4_);
    pcVar4 = *ppcVar6;
    gti._M_current = (GlobalTargetInfo *)cmMakefile::GetTargets_abi_cxx11_(pcVar4);
    local_150._M_current =
         (GlobalTargetInfo *)
         std::
         vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
         ::begin((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                  *)local_130);
    while( true ) {
      local_158._M_current =
           (GlobalTargetInfo *)
           std::
           vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
           ::end((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                  *)local_130);
      bVar1 = __gnu_cxx::operator!=(&local_150,&local_158);
      this_00 = gti;
      if (!bVar1) break;
      __x = __gnu_cxx::
            __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
            ::operator->(&local_150);
      gti_00 = __gnu_cxx::
               __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
               ::operator*(&local_150);
      CreateGlobalTarget(&local_5f8,this,gti_00,pcVar4);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget,_true>
                (&local_3b8,&__x->Name,&local_5f8);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
      ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                *)this_00._M_current,&local_3b8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
      ::~pair(&local_3b8);
      cmTarget::~cmTarget(&local_5f8);
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
      ::operator++(&local_150);
    }
  }
  sVar5 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::size(&this->Makefiles);
  sprintf(local_678,"%d",sVar5 & 0xffffffff);
  pcVar7 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"CMAKE_NUMBER_OF_MAKEFILES",&local_699);
  cmake::AddCacheEntry(pcVar7,&local_698,local_678,"number of local generators",4);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  CheckTargetProperties(this);
  WVar2 = cmake::GetWorkingMode(this->CMakeInstance);
  if (WVar2 == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      std::operator<<((ostream *)local_818,"Configuring incomplete, errors occurred!");
      log = (char **)anon_var_dwarf_1b6590;
      logs[0] = "CMakeError.log";
      logs[1] = (char *)0x0;
      for (f.field_2._8_8_ = &log; *(long *)f.field_2._8_8_ != 0;
          f.field_2._8_8_ = f.field_2._8_8_ + 8) {
        pcVar3 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_860,pcVar3,&local_861);
        std::allocator<char>::~allocator((allocator<char> *)&local_861);
        pcVar3 = cmake::GetCMakeFilesDirectory();
        std::__cxx11::string::operator+=(local_860,pcVar3);
        std::__cxx11::string::operator+=(local_860,"/");
        std::__cxx11::string::operator+=(local_860,*(char **)f.field_2._8_8_);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileExists(pcVar3);
        if (bVar1) {
          poVar8 = std::operator<<((ostream *)local_818,"\nSee also \"");
          poVar8 = std::operator<<(poVar8,local_860);
          std::operator<<(poVar8,"\".");
        }
        std::__cxx11::string::~string(local_860);
      }
    }
    else {
      std::operator<<((ostream *)local_818,"Configuring done");
    }
    pcVar7 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmake::UpdateProgress(pcVar7,pcVar3,-1.0);
    std::__cxx11::string::~string(local_888);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             *)local_130);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  this->Makefiles.push_back(dirMf);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  std::vector<GlobalTargetInfo> globalTargets;
  this->CreateDefaultGlobalTargets(globalTargets);

  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    cmMakefile* mf = this->Makefiles[i];
    cmTargets* targets = &(mf->GetTargets());
    for (std::vector<GlobalTargetInfo>::iterator gti = globalTargets.begin();
         gti != globalTargets.end(); ++gti) {
      targets->insert(
        cmTargets::value_type(gti->Name, this->CreateGlobalTarget(*gti, mf)));
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num, "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccuredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", CM_NULLPTR };
      for (const char** log = logs; *log; ++log) {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if (cmSystemTools::FileExists(f.c_str())) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
  }
}